

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModel.cpp
# Opt level: O2

bool __thiscall HighsModel::operator==(HighsModel *this,HighsModel *model)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = equalButForNames(this,model);
  bVar2 = HighsLp::equalNames(&this->lp_,&model->lp_);
  return bVar2 && bVar1;
}

Assistant:

bool HighsModel::operator==(const HighsModel& model) const {
  bool equal = equalButForNames(model);
  equal = this->lp_.equalNames(model.lp_) && equal;
  return equal;
}